

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Quaternion pbrt::Slerp(Float t,Quaternion *q1,Quaternion *q2)

{
  undefined1 auVar1 [16];
  float fVar2;
  undefined1 extraout_var [12];
  undefined1 auVar4 [16];
  float fVar3;
  undefined1 extraout_var_00 [12];
  undefined1 auVar5 [16];
  undefined1 extraout_var_01 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar14 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar21 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  Quaternion QVar22;
  Quaternion local_70;
  Quaternion local_60;
  Quaternion local_50;
  Quaternion local_40;
  Quaternion local_30;
  Quaternion local_20;
  undefined1 extraout_var_02 [60];
  
  auVar7._0_4_ = AngleBetween(q1,q2);
  auVar7._4_60_ = extraout_var_02;
  auVar4 = SUB6416(ZEXT464(0x3f800000),0);
  auVar1 = vfmadd213ss_fma(auVar7._0_16_,auVar7._0_16_,auVar4);
  if ((auVar1._0_4_ != 1.0) || (NAN(auVar1._0_4_))) {
    fVar2 = sinf(auVar7._0_4_);
    auVar4._0_4_ = fVar2 / auVar7._0_4_;
    auVar4._4_12_ = extraout_var;
  }
  auVar21 = (undefined1  [56])0x0;
  auVar14 = (undefined1  [56])0x0;
  QVar22 = Quaternion::operator*(q1,1.0 - t);
  auVar15._0_8_ = QVar22._8_8_;
  auVar15._8_56_ = auVar21;
  auVar8._0_8_ = QVar22.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar14;
  local_60 = (Quaternion)vmovlhps_avx(auVar8._0_16_,auVar15._0_16_);
  fVar2 = auVar7._0_4_ * (1.0 - t);
  auVar14 = (undefined1  [56])0x0;
  auVar5 = SUB6416(ZEXT464(0x3f800000),0);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),auVar5);
  if ((auVar1._0_4_ != 1.0) || (NAN(auVar1._0_4_))) {
    auVar14 = (undefined1  [56])0x0;
    fVar3 = sinf(fVar2);
    auVar5._0_4_ = fVar3 / fVar2;
    auVar5._4_12_ = extraout_var_00;
  }
  auVar21 = ZEXT856(auVar5._8_8_);
  QVar22 = Quaternion::operator*(&local_60,auVar5._0_4_);
  auVar16._0_8_ = QVar22._8_8_;
  auVar16._8_56_ = auVar14;
  auVar9._0_8_ = QVar22.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar21;
  local_20 = (Quaternion)vmovlhps_avx(auVar9._0_16_,auVar16._0_16_);
  auVar21 = (undefined1  [56])0x0;
  QVar22 = Quaternion::operator/(&local_20,auVar4._0_4_);
  auVar17._0_8_ = QVar22._8_8_;
  auVar17._8_56_ = auVar14;
  auVar10._0_8_ = QVar22.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar21;
  local_50 = (Quaternion)vmovlhps_avx(auVar10._0_16_,auVar17._0_16_);
  auVar21 = (undefined1  [56])0x0;
  QVar22 = Quaternion::operator*(q2,t);
  auVar18._0_8_ = QVar22._8_8_;
  auVar18._8_56_ = auVar14;
  auVar11._0_8_ = QVar22.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar21;
  local_70 = (Quaternion)vmovlhps_avx(auVar11._0_16_,auVar18._0_16_);
  auVar14 = (undefined1  [56])0x0;
  fVar2 = t * auVar7._0_4_;
  auVar6 = SUB6416(ZEXT464(0x3f800000),0);
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),auVar6);
  if ((auVar1._0_4_ != 1.0) || (NAN(auVar1._0_4_))) {
    auVar14 = (undefined1  [56])0x0;
    fVar3 = sinf(fVar2);
    auVar6._0_4_ = fVar3 / fVar2;
    auVar6._4_12_ = extraout_var_01;
  }
  auVar21 = ZEXT856(auVar6._8_8_);
  QVar22 = Quaternion::operator*(&local_70,auVar6._0_4_);
  auVar19._0_8_ = QVar22._8_8_;
  auVar19._8_56_ = auVar14;
  auVar12._0_8_ = QVar22.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar12._8_56_ = auVar21;
  local_40 = (Quaternion)vmovlhps_avx(auVar12._0_16_,auVar19._0_16_);
  auVar21 = (undefined1  [56])0x0;
  QVar22 = Quaternion::operator/(&local_40,auVar4._0_4_);
  auVar20._0_8_ = QVar22._8_8_;
  auVar20._8_56_ = auVar14;
  auVar13._0_8_ = QVar22.v.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar21;
  local_30 = (Quaternion)vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
  QVar22 = Quaternion::operator+(&local_50,&local_30);
  return QVar22;
}

Assistant:

PBRT_CPU_GPU
inline Quaternion Slerp(Float t, const Quaternion &q1, const Quaternion &q2) {
    Float theta = AngleBetween(q1, q2);
    Float sinThetaOverTheta = SinXOverX(theta);
    return q1 * (1 - t) * SinXOverX((1 - t) * theta) / sinThetaOverTheta +
           q2 * t * SinXOverX(t * theta) / sinThetaOverTheta;
}